

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O2

Gnuplot * __thiscall Gnuplot::cmd(Gnuplot *this,string *cmdstr)

{
  long lVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->valid == true) {
    std::operator+(&local_40,cmdstr,"\n");
    fputs(local_40._M_dataplus._M_p,(FILE *)this->gnucmd);
    std::__cxx11::string::~string((string *)&local_40);
    fflush((FILE *)this->gnucmd);
    lVar1 = std::__cxx11::string::find((char *)cmdstr,0x1050de);
    if (lVar1 == -1) {
      bVar2 = false;
      lVar1 = std::__cxx11::string::find((char *)cmdstr,0x1050e5);
      if (lVar1 == -1) {
        lVar1 = std::__cxx11::string::find((char *)cmdstr,0x1050e0);
        bVar2 = true;
        if (lVar1 == -1) {
          return this;
        }
      }
      this->two_dim = bVar2;
      this->nplots = this->nplots + 1;
    }
  }
  return this;
}

Assistant:

Gnuplot& Gnuplot::cmd(const std::string &cmdstr) {
  if (!(valid)) {
    return *this;
  }

  // int fputs ( const char * str, FILE * stream );
  // writes the string str to the stream.
  // The function begins copying from the address specified (str) until it
  // reaches the terminating null character ('\0'). This final
  // null-character is not copied to the stream.
  fputs((cmdstr + "\n").c_str(), gnucmd);

  // int fflush ( FILE * stream );
  // If the given stream was open for writing and the last i/o operation was
  // an output operation, any unwritten data in the output buffer is written
  // to the file.  If the argument is a null pointer, all open files are
  // flushed.  The stream remains open after this call.
  fflush(gnucmd);

  if (cmdstr.find("replot") != std::string::npos) {
    return *this;
  } else if (cmdstr.find("splot") != std::string::npos) {
    two_dim = false;
    nplots++;
  } else if (cmdstr.find("plot") != std::string::npos) {
    two_dim = true;
    nplots++;
  }

  return *this;
}